

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O1

bool Kernel::InferenceStore::Smt2ProofCheckPrinter::isBuiltInSort(ostream *out,uint sortCons)

{
  uint arity;
  undefined1 auVar1 [16];
  long lVar2;
  AtomicSort *pAVar3;
  Entry *pEVar4;
  TermList TVar5;
  ulong uVar6;
  undefined8 in_RCX;
  bool bVar7;
  Stack<Kernel::TermList> args;
  uint local_60 [4];
  Stack<Kernel::TermList> local_50;
  
  lVar2 = DAT_00b7e1b0;
  arity = *(uint *)(*(long *)(*(long *)(DAT_00b7e1b0 + 0xa0) + (long)(int)sortCons * 8) + 0x20);
  local_60[1] = 0;
  local_60[2] = 0;
  auVar1._4_8_ = in_RCX;
  auVar1._0_4_ = arity;
  auVar1._12_4_ = 0;
  local_60[3] = arity;
  ::Lib::Stack<Kernel::TermList>::
  fromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Kernel::InferenceStore::Smt2ProofCheckPrinter::isBuiltInSort(std::ostream&,unsigned_int)::_lambda(auto:1)_1_,Kernel::TermList>>>
            (&local_50,(Stack<Kernel::TermList> *)(ulong)local_60[0],
             (IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_InferenceStore_cpp:856:20),_Kernel::TermList>_>
              )(auVar1 << 0x20));
  pAVar3 = AtomicSort::create(sortCons,arity,local_50._stack);
  if (((ulong)pAVar3 & 3) == 0) {
    local_60[0] = (pAVar3->super_Term)._functor;
    pEVar4 = ::Lib::DHMap<unsigned_int,_Shell::TermAlgebra_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
             findEntry((DHMap<unsigned_int,_Shell::TermAlgebra_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                        *)(DAT_00b7e1b0 + 0x268),local_60);
    if (pEVar4 != (Entry *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (out,"=== warning term algebras are not yet implemented for proof checking ==",0x47)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
      std::ostream::put((char)out);
      std::ostream::flush();
    }
  }
  bVar7 = true;
  if (*(uint *)(lVar2 + 0x208) != sortCons || *(uint *)(lVar2 + 0x208) == 0xffffffff) {
    TVar5 = AtomicSort::intSort();
    if ((AtomicSort *)TVar5._content != pAVar3) {
      TVar5 = AtomicSort::realSort();
      if ((AtomicSort *)TVar5._content != pAVar3) {
        TVar5 = AtomicSort::rationalSort();
        bVar7 = (AtomicSort *)TVar5._content == pAVar3;
      }
    }
  }
  if (local_50._stack != (TermList *)0x0) {
    uVar6 = local_50._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      (local_50._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_50._stack;
    }
    else if (uVar6 < 0x11) {
      (local_50._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_50._stack;
    }
    else if (uVar6 < 0x19) {
      (local_50._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_50._stack;
    }
    else if (uVar6 < 0x21) {
      (local_50._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_50._stack;
    }
    else if (uVar6 < 0x31) {
      (local_50._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_50._stack;
    }
    else if (uVar6 < 0x41) {
      (local_50._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_50._stack;
    }
    else {
      operator_delete(local_50._stack,0x10);
    }
  }
  return bVar7;
}

Assistant:

static bool isBuiltInSort(std::ostream& out, unsigned sortCons) {
    auto& sig = *env.signature;
    auto arity = sig.typeConArity(sortCons);
    auto args = range(0, arity)
              .map([](auto _a) { return AtomicSort::intSort(); })
              .template collect<Stack>();
    auto sortInstance = TermList(AtomicSort::create(sortCons, arity, args.begin()));
    if (env.signature->isTermAlgebraSort(sortInstance)) {
      out << "=== warning term algebras are not yet implemented for proof checking ==" << std::endl;
    }
    return sig.isArrayCon(sortCons)
      || sortInstance == AtomicSort::intSort()
      || sortInstance == AtomicSort::realSort()
      || sortInstance == AtomicSort::rationalSort();
  }